

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pOVar1;
  Allocator **ppAVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar9;
  ulong uVar6;
  undefined4 uVar10;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 *puVar14;
  int *piVar15;
  bool bVar16;
  undefined1 *puVar17;
  char cVar18;
  int iVar19;
  float *pfVar20;
  size_t sVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  vector<Object,_std::allocator<Object>_> *objects_00;
  pointer pOVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  int w;
  float fVar30;
  __m128 t_2;
  undefined1 auVar29 [16];
  int iVar31;
  int iVar33;
  undefined8 uVar32;
  __m128 t;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  undefined1 local_348 [64];
  size_t local_308;
  vector<Object,_std::allocator<Object>_> objects;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_288 [64];
  size_t local_248;
  undefined1 local_238 [16];
  float norm_vals [3];
  Mat image;
  undefined4 local_200;
  int iStack_1fc;
  Allocator *local_1e8;
  Net yolov5;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar11 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar11,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov5);
    if ((Allocator **)yolov5._vptr_Net != &yolov5.opt.blob_allocator) {
      operator_delete(yolov5._vptr_Net);
    }
    cVar18 = cv::Mat::empty();
    if (cVar18 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      iVar19 = ncnn::Net::load_param(&yolov5,"yolov5s.ncnn.param");
      if ((iVar19 != 0) || (iVar19 = ncnn::Net::load_model(&yolov5,"yolov5s.ncnn.bin"), iVar19 != 0)
         ) {
        exit(-1);
      }
      iVar19 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar19 < w) {
        fVar34 = 640.0 / (float)w;
        uVar24 = CONCAT44((int)((float)iVar19 * fVar34),0x280);
      }
      else {
        fVar34 = 640.0 / (float)iVar19;
        uVar24 = CONCAT44(0x280,(int)((float)w * fVar34));
      }
      local_238._8_8_ = 0;
      local_238._0_8_ = uVar24;
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,0x10002,w,iVar19,(int)uVar24,(int)(uVar24 >> 0x20),
                 (Allocator *)0x0);
      local_248 = 0;
      local_288._0_4_ = 0;
      local_288._4_4_ = 0;
      local_288._8_4_ = 0;
      local_288._12_4_ = 0;
      local_288._16_4_ = 0;
      local_288._20_4_ = 0;
      local_288._24_4_ = 0;
      local_288._32_8_ = (Allocator *)0x0;
      local_288._40_4_ = 0;
      local_288._44_4_ = 0;
      local_288._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar31 = ((local_238._0_4_ + 0x3f) / 0x40) * 0x40 - local_238._0_4_;
      iVar33 = ((local_238._4_4_ + 0x3f) / 0x40) * 0x40 - local_238._4_4_;
      local_238._0_4_ = iVar31 / 2;
      local_238._4_4_ = iVar33 / 2;
      objects_00 = (vector<Object,_std::allocator<Object>_> *)(ulong)(uint)local_238._0_4_;
      local_238._8_4_ = (int)-local_238._8_4_ / 2;
      local_238._12_4_ = (int)-local_238._12_4_ / 2;
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_288,local_238._4_4_,iVar33 - local_238._4_4_,
                 local_238._0_4_,iVar31 - local_238._0_4_,0,114.0,(Option *)&areas);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize((Mat *)local_288,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",(Mat *)local_288);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out0",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar14 = 0x4150000041200000;
      puVar14[1] = 0x41f0000041800000;
      puVar14[2] = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,8,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out1",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar14 = 0x4274000041f00000;
      puVar14[1] = 0x4234000042780000;
      puVar14[2] = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x10,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out2",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar14 = 0x42b4000042e80000;
      puVar14[1] = 0x43460000431c0000;
      puVar14[2] = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x20,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar25 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
        pOVar25 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (int *)0x0;
      uVar26 = (int)((long)pOVar25 -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar26,(allocator_type *)&objects8);
      if (0 < (int)uVar26) {
        pfVar20 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar24 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar24] = pfVar20[-1] * *pfVar20;
          uVar24 = uVar24 + 1;
          pfVar20 = pfVar20 + 6;
        } while ((uVar26 & 0x7fffffff) != uVar24);
        auVar29._12_4_ = 0;
        auVar29._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar29 << 0x20;
        iVar31 = 0;
        do {
          uVar23 = (uint)((ulong)(local_348._8_8_ - CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2)
          ;
          if ((int)uVar23 < 1) {
LAB_00158a6d:
            if (local_348._8_8_ == local_348._16_8_) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_348,(iterator)local_348._8_8_,
                         (int *)&objects8);
            }
            else {
              *(int *)local_348._8_8_ = iVar31;
              local_348._8_8_ = local_348._8_8_ + 4;
            }
          }
          else {
            pOVar25 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar31;
            bVar16 = true;
            uVar24 = 0;
            do {
              iVar33 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar24 * 4);
              if (pOVar25->label ==
                  proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar33].label) {
                pOVar1 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar33;
                uVar5._0_4_ = (pOVar25->rect).x;
                uVar5._4_4_ = (pOVar25->rect).y;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar5;
                uVar3 = (pOVar25->rect).width;
                uVar9 = (pOVar25->rect).height;
                uVar6._0_4_ = (pOVar1->rect).x;
                uVar6._4_4_ = (pOVar1->rect).y;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = uVar6;
                uVar4 = (pOVar1->rect).width;
                uVar10 = (pOVar1->rect).height;
                auVar40._0_4_ = (float)uVar4 + (float)(undefined4)uVar6;
                auVar40._4_4_ = (float)uVar10 + (float)uVar6._4_4_;
                auVar40._8_8_ = 0;
                auVar38 = maxps(auVar37,auVar38);
                auVar35._0_4_ = (float)uVar3 + (float)(undefined4)uVar5;
                auVar35._4_4_ = (float)uVar9 + (float)uVar5._4_4_;
                auVar35._8_8_ = 0;
                auVar29 = minps(auVar40,auVar35);
                fVar27 = auVar29._0_4_ - auVar38._0_4_;
                fVar30 = auVar29._4_4_ - auVar38._4_4_;
                fVar28 = 0.0;
                if (0.0 < fVar30 && 0.0 < fVar27) {
                  fVar28 = fVar27 * fVar30;
                }
                if (0.45 < fVar28 / ((areas.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[iVar31] +
                                     areas.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_start[iVar33]) - fVar28)) {
                  bVar16 = false;
                }
              }
              uVar24 = uVar24 + 1;
            } while ((uVar23 & 0x7fffffff) != uVar24);
            if (bVar16) goto LAB_00158a6d;
          }
          iVar31 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ + 1;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (float)iVar31;
        } while (iVar31 < (int)uVar26);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar26 = (uint)((ulong)(local_348._8_8_ - CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar26);
      if (0 < (int)uVar26) {
        uVar32 = CONCAT44((float)(iVar19 + -1),(float)(w + -1));
        lVar22 = 0;
        uVar24 = 0;
        do {
          iVar19 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar24 * 4);
          uVar7 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar19].rect.width;
          puVar14 = (undefined8 *)
                    ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).x + lVar22);
          *puVar14 = *(undefined8 *)
                      &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar19].rect;
          puVar14[1] = uVar7;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar22) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19].label;
          uVar7 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22);
          uVar8 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar22);
          fVar27 = (float)uVar7;
          fVar28 = (float)((ulong)uVar7 >> 0x20);
          auVar36._0_4_ = fVar27 - (float)(int)local_238._0_4_;
          auVar36._4_4_ = fVar28 - (float)(int)local_238._4_4_;
          auVar36._8_4_ = 0.0 - (float)(int)local_238._8_4_;
          auVar36._12_4_ = 0.0 - (float)(int)local_238._12_4_;
          auVar12._4_4_ = fVar34;
          auVar12._0_4_ = fVar34;
          auVar12._8_4_ = fVar34;
          auVar12._12_4_ = fVar34;
          auVar29 = divps(auVar36,auVar12);
          auVar39._0_4_ = ((float)uVar8 + fVar27) - (float)(int)local_238._0_4_;
          auVar39._4_4_ = ((float)((ulong)uVar8 >> 0x20) + fVar28) - (float)(int)local_238._4_4_;
          auVar39._8_4_ = 0.0 - (float)(int)local_238._8_4_;
          auVar39._12_4_ = 0.0 - (float)(int)local_238._12_4_;
          auVar13._4_4_ = fVar34;
          auVar13._0_4_ = fVar34;
          auVar13._8_4_ = fVar34;
          auVar13._12_4_ = fVar34;
          auVar40 = divps(auVar39,auVar13);
          auVar41._8_4_ = 0xbf800000;
          auVar41._0_8_ = uVar32;
          auVar41._12_4_ = 0xbf800000;
          auVar29 = minps(auVar41,auVar29);
          auVar29 = maxps(ZEXT816(0),auVar29);
          auVar42._8_4_ = 0xbf800000;
          auVar42._0_8_ = uVar32;
          auVar42._12_4_ = 0xbf800000;
          auVar40 = minps(auVar42,auVar40);
          auVar40 = maxps(ZEXT816(0),auVar40);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22) = auVar29._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar22) =
               CONCAT44(auVar40._4_4_ - auVar29._4_4_,auVar40._0_4_ - auVar29._0_4_);
          uVar24 = uVar24 + 1;
          lVar22 = lVar22 + 0x18;
        } while ((uVar26 & 0x7fffffff) != uVar24);
      }
      if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar15 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_288._4_4_,local_288._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_288._4_4_,local_288._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_288._32_8_)[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(iStack_1fc,local_200);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      puVar17 = (undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar22 = 0;
        uVar24 = 0;
        pOVar25 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_238._0_8_ = uVar24;
          local_288._0_8_ = puVar17;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar25->prob + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).x + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).y + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).width + lVar22),
                  (double)*(float *)((long)&(pOVar25->rect).height + lVar22),
                  (ulong)*(uint *)((long)&pOVar25->label + lVar22));
          local_288._16_4_ = 0;
          local_288._20_4_ = 0;
          local_288._0_4_ = 0x3010000;
          pfVar20 = (float *)((long)&(pOVar25->rect).x + lVar22);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar20[1]);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar20);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar20[2]);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar20[3]);
          yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov5.opt.workspace_allocator = (Allocator *)0x0;
          yolov5.opt.lightmode = false;
          yolov5.opt._1_3_ = 0;
          yolov5.opt.num_threads = 0;
          yolov5.opt.blob_allocator = (Allocator *)0x0;
          local_288._8_8_ = &image;
          cv::rectangle((string *)local_288,&proposals,&yolov5,1,8,0);
          sprintf((char *)&yolov5,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar25->prob + lVar22) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar25->label + lVar22) * 4));
          local_288._0_8_ = local_288 + 0x10;
          sVar21 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,&yolov5,(long)&yolov5._vptr_Net + sVar21);
          cv::getTextSize((string *)&ex,(int)(string *)local_288,0.5,0,(int *)0x1);
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_);
          }
          fVar34 = (float)(int)*(float *)((long)&(pOVar25->rect).x + lVar22);
          iVar19 = (int)((*(float *)((long)&(pOVar25->rect).y + lVar22) -
                         (float)ex._vptr_Extractor._4_4_) - 0.0);
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          fVar27 = (float)(iStack_1fc - (int)ex._vptr_Extractor);
          if ((int)ex._vptr_Extractor + (int)fVar34 <= iStack_1fc) {
            fVar27 = fVar34;
          }
          local_348._16_8_ = 0;
          local_348._0_4_ = 0x3010000;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = iVar19;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = fVar27;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ex._vptr_Extractor;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
          local_288._0_4_ = 0;
          local_288._4_4_ = 0x406fe000;
          local_288._8_4_ = 0;
          local_288._12_4_ = 0x406fe000;
          local_288._16_4_ = 0;
          local_288._20_4_ = 0x406fe000;
          local_288._24_4_ = 0;
          local_288._28_4_ = 0;
          local_348._8_8_ = &image;
          cv::rectangle(local_348,&objects8,(string *)local_288,0xffffffff,8,0);
          local_348._16_8_ = (int *)0x0;
          local_348._0_4_ = 0x3010000;
          local_288._0_8_ = local_288 + 0x10;
          local_348._8_8_ = &image;
          sVar21 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,&yolov5,(long)&yolov5._vptr_Net + sVar21);
          norm_vals[1] = (float)(iVar19 + ex._vptr_Extractor._4_4_);
          norm_vals[0] = fVar27;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,local_348,(string *)local_288,norm_vals,0,&areas,1,8,0);
          uVar32 = local_238._0_8_;
          puVar17 = (undefined1 *)local_288._0_8_;
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_);
            puVar17 = (undefined1 *)local_288._0_8_;
          }
          local_288._4_4_ = (undefined4)((ulong)puVar17 >> 0x20);
          uVar24 = uVar32 + 1;
          lVar22 = lVar22 + 0x18;
          pOVar25 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar24 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_288._8_8_ = &image;
      ppAVar2 = &yolov5.opt.blob_allocator;
      yolov5.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov5.opt.blob_allocator._6_2_,0x6567616d69);
      yolov5.opt.lightmode = true;
      yolov5.opt._1_3_ = 0;
      yolov5.opt.num_threads = 0;
      local_288._16_4_ = 0;
      local_288._20_4_ = 0;
      local_288._0_4_ = 0x1010000;
      yolov5._vptr_Net = (_func_int **)ppAVar2;
      cv::imshow((string *)&yolov5,(_InputArray *)local_288);
      if ((Allocator **)yolov5._vptr_Net != ppAVar2) {
        operator_delete(yolov5._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar19 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar11);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}